

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  sqlite3 *psVar1;
  Table *pTable;
  bool bVar2;
  int iVar3;
  Table *pTVar4;
  undefined4 extraout_var;
  char *pcVar5;
  Table *extraout_RAX;
  Table *extraout_RAX_00;
  Table *extraout_RAX_01;
  Table *extraout_RAX_02;
  Table *extraout_RAX_03;
  Table *extraout_RAX_04;
  char *pcVar6;
  Table *pMod;
  char *local_40;
  char *local_38;
  
  psVar1 = pParse->db;
  if (((psVar1->mDbFlags & 8) == 0) && (iVar3 = sqlite3ReadSchema(pParse), iVar3 != 0)) {
    return (Table *)0x0;
  }
  pTVar4 = sqlite3FindTable(psVar1,zName,zDbase);
  if (pTVar4 != (Table *)0x0) {
    return pTVar4;
  }
  pcVar6 = "no such view";
  if ((flags & 1) == 0) {
    pcVar6 = "no such table";
  }
  pTVar4 = (Table *)findElementWithHash(&psVar1->aModule,zName,(uint *)0x0);
  pMod = (Table *)pTVar4->pIndex;
  if ((Table *)pTVar4->pIndex == (Table *)0x0) {
    iVar3 = sqlite3_strnicmp(zName,"pragma_",7);
    pTVar4 = (Table *)CONCAT44(extraout_var,iVar3);
    if (((iVar3 == 0) && (pTVar4 = (Table *)pragmaLocate(zName + 7), pTVar4 != (Table *)0x0)) &&
       (((ulong)pTVar4->aCol & 0x3000) != 0)) {
      pTVar4 = (Table *)sqlite3VtabCreateModule
                                  (psVar1,zName,&pragmaVtabModule,pTVar4,(_func_void_void_ptr *)0x0)
      ;
      pMod = pTVar4;
    }
    else {
      pMod = (Table *)0x0;
    }
  }
  if (pMod != (Table *)0x0) {
    pcVar5 = pMod->zName;
    local_40 = (char *)0x0;
    if (pMod->pFKey != (FKey *)0x0) {
LAB_00127c22:
      pTVar4 = (Table *)pMod->pFKey;
      bVar2 = false;
      goto LAB_00127de7;
    }
    psVar1 = pParse->db;
    pTVar4 = *(Table **)(pcVar5 + 8);
    if (((pTVar4 == (Table *)0x0) || (pTVar4 == *(Table **)(pcVar5 + 0x10))) &&
       (local_38 = pcVar5, pTVar4 = (Table *)sqlite3DbMallocZero(psVar1,0x80),
       pTVar4 != (Table *)0x0)) {
      pcVar5 = sqlite3DbStrDup(psVar1,(char *)pMod->aCol);
      pTVar4->zName = pcVar5;
      if (pcVar5 == (char *)0x0) {
        sqlite3DbFreeNN(psVar1,pTVar4);
        pTVar4 = extraout_RAX_02;
      }
      else {
        pMod->pFKey = (FKey *)pTVar4;
        pTVar4->nTabRef = 1;
        pTVar4->pSchema = psVar1->aDb->pSchema;
        pTVar4->iPKey = -1;
        pcVar5 = sqlite3DbStrDup(psVar1,pcVar5);
        addModuleArgument(psVar1,pTVar4,pcVar5);
        addModuleArgument(psVar1,pTVar4,(char *)0x0);
        pcVar5 = sqlite3DbStrDup(psVar1,pTVar4->zName);
        addModuleArgument(psVar1,pTVar4,pcVar5);
        iVar3 = vtabCallConstructor(psVar1,pTVar4,(Module *)pMod,
                                    *(_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                                      **)(local_38 + 0x10),&local_40);
        pcVar5 = local_40;
        if (iVar3 == 0) goto LAB_00127c22;
        sqlite3ErrorMsg(pParse,"%s",local_40);
        pTVar4 = extraout_RAX;
        if (pcVar5 != (char *)0x0) {
          sqlite3DbFreeNN(psVar1,pcVar5);
          pTVar4 = extraout_RAX_00;
        }
        pTable = (Table *)pMod->pFKey;
        if (pTable != (Table *)0x0) {
          *(byte *)&pTable->tabFlags = (byte)pTable->tabFlags | 2;
          sqlite3DeleteTable(psVar1,pTable);
          pMod->pFKey = (FKey *)0x0;
          pTVar4 = extraout_RAX_01;
        }
      }
    }
  }
  bVar2 = true;
  if ((flags & 2) == 0) {
    if (zDbase == (char *)0x0) {
      sqlite3ErrorMsg(pParse,"%s: %s",pcVar6,zName);
      pTVar4 = extraout_RAX_04;
    }
    else {
      sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar6,zDbase,zName);
      pTVar4 = extraout_RAX_03;
    }
    pParse->checkSchema = '\x01';
  }
LAB_00127de7:
  if (bVar2) {
    return (Table *)0x0;
  }
  return pTVar4;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;
  sqlite3 *db = pParse->db;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( (db->mDbFlags & DBFLAG_SchemaKnownOk)==0 
   && SQLITE_OK!=sqlite3ReadSchema(pParse)
  ){
    return 0;
  }

  p = sqlite3FindTable(db, zName, zDbase);
  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
#ifndef SQLITE_OMIT_VIRTUALTABLE
    /* If zName is the not the name of a table in the schema created using
    ** CREATE, then check to see if it is the name of an virtual table that
    ** can be an eponymous virtual table. */
    Module *pMod = (Module*)sqlite3HashFind(&db->aModule, zName);
    if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
      pMod = sqlite3PragmaVtabRegister(db, zName);
    }
    if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
      return pMod->pEpoTab;
    }
#endif
    if( (flags & LOCATE_NOERR)==0 ){
      if( zDbase ){
        sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
      }else{
        sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
      }
      pParse->checkSchema = 1;
    }
  }

  return p;
}